

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O3

size_t uv__count_bufs(uv_buf_t *bufs,uint nbufs)

{
  size_t sVar1;
  long lVar2;
  
  if (nbufs != 0) {
    lVar2 = 0;
    sVar1 = 0;
    do {
      sVar1 = sVar1 + *(long *)((long)&bufs->len + lVar2);
      lVar2 = lVar2 + 0x10;
    } while ((ulong)nbufs << 4 != lVar2);
    return sVar1;
  }
  return 0;
}

Assistant:

size_t uv__count_bufs(const uv_buf_t bufs[], unsigned int nbufs) {
  unsigned int i;
  size_t bytes;

  bytes = 0;
  for (i = 0; i < nbufs; i++)
    bytes += (size_t) bufs[i].len;

  return bytes;
}